

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

HostTexture * host_create_texture(Host *host,int w,int h,HostTextureFormat format)

{
  u32 uVar1;
  u32 uVar2;
  HostTexture *pHVar3;
  GLTextureFormat GVar4;
  GLuint handle;
  
  pHVar3 = (HostTexture *)malloc(0x18);
  uVar1 = next_power_of_two(w);
  pHVar3->width = uVar1;
  uVar2 = next_power_of_two(h);
  pHVar3->height = uVar2;
  glGenTextures(1,&handle);
  glBindTexture(0xde1,handle);
  GVar4 = host_apply_texture_format(format);
  glTexImage2D(0xde1,0,GVar4.internal_format,uVar1,uVar2,0,GVar4._0_8_ >> 0x20,0x1401,0);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2801,0x2600);
  pHVar3->handle = (ulong)handle;
  pHVar3->format = format;
  return pHVar3;
}

Assistant:

HostTexture* host_create_texture(Host* host, int w, int h,
                                 HostTextureFormat format) {
  HostTexture* texture = xmalloc(sizeof(HostTexture));
  texture->width = next_power_of_two(w);
  texture->height = next_power_of_two(h);

  GLuint handle;
  glGenTextures(1, &handle);
  glBindTexture(GL_TEXTURE_2D, handle);
  GLTextureFormat gl_format = host_apply_texture_format(format);
  glTexImage2D(GL_TEXTURE_2D, 0, gl_format.internal_format, texture->width,
               texture->height, 0, gl_format.format, gl_format.type, NULL);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

  texture->handle = handle;
  texture->format = format;
  return texture;
}